

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *pcVar1;
  EnumDescriptor *pEVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_60;
  char *local_58;
  ulong local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  ulong local_30;
  long local_28;
  undefined8 local_20;
  char *local_18;
  
  pEVar2 = google::protobuf::FieldDescriptor::enum_type((FieldDescriptor *)**(undefined8 **)this);
  pcVar1 = (pEVar2->all_names_).payload_;
  local_50 = (ulong)*(ushort *)(pcVar1 + 2);
  local_28 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  local_30 = (ulong)*(ushort *)(local_28 + 2);
  local_60 = 0xb;
  local_58 = "Enum type \"";
  pieces._M_len = pcVar1 + ~local_50;
  local_40 = 0x27;
  local_38 = "\" is not an open enum, but is used in \"";
  local_28 = ~local_30 + local_28;
  local_20 = 0x21;
  local_18 = "\" which is a proto3 message type.";
  pieces._M_array = (iterator)&DAT_00000005;
  local_48 = pieces._M_len;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_60,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}